

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_dyn_vector.cpp
# Opt level: O1

void msd_D_adaptive<std::deque<unsigned_char*,std::allocator<unsigned_char*>>>
               (uchar **strings,size_t n,size_t depth,
               deque<unsigned_char_*,_std::allocator<unsigned_char_*>_> *buckets)

{
  deque<unsigned_char*,std::allocator<unsigned_char*>> *pdVar1;
  uchar *puVar2;
  undefined8 *puVar3;
  long *plVar4;
  long lVar5;
  size_t n_00;
  size_t j;
  long *__ptr;
  long lVar6;
  _Map_pointer *ppppuVar7;
  undefined2 uVar8;
  ulong uVar9;
  uint uVar10;
  uchar **__args;
  uchar **ppuVar11;
  uint i;
  size_t j_1;
  long lVar12;
  ulong uVar13;
  uint16_t cache [16];
  _Deque_iterator<unsigned_char_*,_unsigned_char_*const_&,_unsigned_char_*const_*> local_78;
  _Deque_iterator<unsigned_char_*,_unsigned_char_*const_&,_unsigned_char_*const_*> local_50;
  
  if (n < 0x10000) {
    msd_D<std::deque<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_short>
              (strings,n,depth,buckets);
    return;
  }
  __ptr = (long *)malloc(0x80000);
  if ((n & 0xfffffffffffffff0) == 0) {
    uVar13 = 0;
  }
  else {
    uVar13 = 0;
    ppuVar11 = strings;
    do {
      lVar6 = 0;
      do {
        puVar2 = ppuVar11[lVar6];
        if (puVar2 == (uchar *)0x0) goto LAB_00195e65;
        if (puVar2[depth] == '\0') {
          uVar8 = 0;
        }
        else {
          uVar8 = CONCAT11(puVar2[depth],puVar2[depth + 1]);
        }
        *(undefined2 *)((long)&local_78._M_cur + lVar6 * 2) = uVar8;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0x10);
      lVar6 = 0;
      __args = ppuVar11;
      do {
        uVar9 = (ulong)((uint)*(ushort *)((long)&local_78._M_cur + lVar6 * 2) * 0x50);
        pdVar1 = (deque<unsigned_char*,std::allocator<unsigned_char*>> *)
                 ((long)&(buckets->
                         super__Deque_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                         _M_impl.super__Deque_impl_data._M_map + uVar9);
        puVar3 = *(undefined8 **)
                  ((long)&(buckets->
                          super__Deque_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                          _M_impl.super__Deque_impl_data._M_finish._M_cur + uVar9);
        if (puVar3 == (undefined8 *)
                      (*(long *)((long)&(buckets->
                                        super__Deque_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>
                                        )._M_impl.super__Deque_impl_data._M_finish._M_last + uVar9)
                      + -8)) {
          std::deque<unsigned_char*,std::allocator<unsigned_char*>>::
          _M_push_back_aux<unsigned_char*const&>(pdVar1,__args);
        }
        else {
          *puVar3 = *__args;
          pdVar1 = pdVar1 + 0x30;
          *(long *)pdVar1 = *(long *)pdVar1 + 8;
        }
        lVar6 = lVar6 + 1;
        __args = __args + 1;
      } while (lVar6 != 0x10);
      uVar13 = uVar13 + 0x10;
      ppuVar11 = ppuVar11 + 0x10;
    } while (uVar13 < (n & 0xfffffffffffffff0));
  }
  lVar6 = n - uVar13;
  if (uVar13 <= n && lVar6 != 0) {
    ppuVar11 = strings + uVar13;
    do {
      puVar2 = *ppuVar11;
      if (puVar2 == (uchar *)0x0) {
LAB_00195e65:
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x2e,"uint16_t get_char(unsigned char *, size_t)");
      }
      if (puVar2[depth] == '\0') {
        uVar10 = 0;
      }
      else {
        uVar10 = (uint)CONCAT11(puVar2[depth],puVar2[depth + 1]);
      }
      uVar13 = (ulong)(uVar10 * 0x50);
      pdVar1 = (deque<unsigned_char*,std::allocator<unsigned_char*>> *)
               ((long)&(buckets->
                       super__Deque_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>)._M_impl
                       .super__Deque_impl_data._M_map + uVar13);
      plVar4 = *(long **)((long)&(buckets->
                                 super__Deque_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>
                                 )._M_impl.super__Deque_impl_data._M_finish._M_cur + uVar13);
      if (plVar4 == (long *)(*(long *)((long)&(buckets->
                                              super__Deque_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>
                                              )._M_impl.super__Deque_impl_data._M_finish._M_last +
                                      uVar13) + -8)) {
        std::deque<unsigned_char*,std::allocator<unsigned_char*>>::
        _M_push_back_aux<unsigned_char*const&>(pdVar1,ppuVar11);
      }
      else {
        *plVar4 = (long)puVar2;
        pdVar1 = pdVar1 + 0x30;
        *(long *)pdVar1 = *(long *)pdVar1 + 8;
      }
      ppuVar11 = ppuVar11 + 1;
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
  }
  ppppuVar7 = &(buckets->super__Deque_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
               _M_impl.super__Deque_impl_data._M_finish._M_node;
  lVar6 = 0;
  do {
    __ptr[lVar6] = ((long)ppppuVar7[-5] - (long)ppppuVar7[-7] >> 3) +
                   ((long)((iterator *)(ppppuVar7 + -3))->_M_cur - (long)ppppuVar7[-2] >> 3) +
                   ((((ulong)((long)*ppppuVar7 - (long)ppppuVar7[-4]) >> 3) - 1) +
                   (ulong)(*ppppuVar7 == (_Map_pointer)0x0)) * 0x40;
    lVar6 = lVar6 + 1;
    ppppuVar7 = ppppuVar7 + 10;
  } while (lVar6 != 0x10000);
  ppppuVar7 = &(buckets->super__Deque_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
               _M_impl.super__Deque_impl_data._M_finish._M_node;
  lVar6 = 0;
  lVar12 = 0;
  do {
    lVar5 = __ptr[lVar6];
    if (lVar5 != 0) {
      local_78._M_cur = (_Elt_pointer)ppppuVar7[-7];
      local_78._M_first = (_Elt_pointer)ppppuVar7[-6];
      local_78._M_last = (_Elt_pointer)ppppuVar7[-5];
      local_78._M_node = ppppuVar7[-4];
      local_50._M_cur = ((iterator *)(ppppuVar7 + -3))->_M_cur;
      local_50._M_first = (_Elt_pointer)ppppuVar7[-2];
      local_50._M_last = (_Elt_pointer)ppppuVar7[-1];
      local_50._M_node = *ppppuVar7;
      std::
      __copy_move_dit<false,unsigned_char*,unsigned_char*const&,unsigned_char*const*,unsigned_char**>
                (&local_78,&local_50,strings + lVar12);
      lVar12 = lVar12 + lVar5;
    }
    lVar6 = lVar6 + 1;
    ppppuVar7 = ppppuVar7 + 10;
  } while (lVar6 != 0x10000);
  lVar6 = 0;
  do {
    std::deque<unsigned_char_*,_std::allocator<unsigned_char_*>_>::clear
              ((deque<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)
               ((long)&(buckets->
                       super__Deque_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>)._M_impl
                       .super__Deque_impl_data._M_map + lVar6));
    lVar6 = lVar6 + 0x50;
  } while (lVar6 != 0x500000);
  lVar6 = *__ptr;
  lVar12 = 1;
  do {
    n_00 = __ptr[lVar12];
    if (n_00 != 0) {
      if ((char)lVar12 != '\0') {
        msd_D_adaptive<std::deque<unsigned_char*,std::allocator<unsigned_char*>>>
                  (strings + lVar6,n_00,depth + 2,buckets);
      }
      lVar6 = lVar6 + n_00;
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 0x10000);
  free(__ptr);
  return;
}

Assistant:

static void
msd_D_adaptive(unsigned char** strings, size_t n, size_t depth, Bucket* buckets)
{
	if (n < 0x10000) {
		msd_D<Bucket, uint16_t>(strings, n, depth, buckets);
		return;
	}
	size_t* bucketsize = (size_t*) malloc(0x10000 * sizeof(size_t));
	size_t i=0;
	for (; i < n-n%16; i+=16) {
		uint16_t cache[16];
		for (size_t j=0; j < 16; ++j) {
			cache[j] = get_char<uint16_t>(strings[i+j], depth);
		}
		for (size_t j=0; j < 16; ++j) {
			buckets[cache[j]].push_back(strings[i+j]);
		}
	}
	for (; i < n; ++i) {
		const uint16_t ch = get_char<uint16_t>(strings[i], depth);
		buckets[ch].push_back(strings[i]);
	}
	for (unsigned i=0; i < 0x10000; ++i) {
		bucketsize[i] = buckets[i].size();
	}
	size_t pos = 0;
	for (unsigned i=0; i < 0x10000; ++i) {
		if (bucketsize[i] == 0) continue;
		copy(buckets[i], strings+pos);
		pos += bucketsize[i];
	}
	for (unsigned i=0; i < 0x10000; ++i) {
		buckets[i].clear();
	}
	pos = bucketsize[0];
	for (unsigned i=1; i < 0x10000; ++i) {
		if (bucketsize[i] == 0) continue;
		if (i & 0xFF) msd_D_adaptive(
				strings+pos, bucketsize[i],
				depth+2, buckets);
		pos += bucketsize[i];
	}
	free(bucketsize);
}